

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage_data.c
# Opt level: O0

mpt_value_store * mpt_stage_data(mpt_rawdata_stage *st,uint dim)

{
  int iVar1;
  int *piVar2;
  mpt_type_traits *pmVar3;
  mpt_buffer *pmVar4;
  uint local_40;
  int local_3c;
  uint used;
  uint max;
  mpt_value_store *val;
  mpt_type_traits *traits;
  mpt_buffer *buf;
  uint dim_local;
  mpt_rawdata_stage *st_local;
  
  pmVar4 = (st->_d)._buf;
  local_40 = 0;
  if ((st->_max_dimensions == '\0') || (dim < st->_max_dimensions)) {
    pmVar3 = mpt_value_store_traits();
    if (pmVar3 == (mpt_type_traits *)0x0) {
      piVar2 = __errno_location();
      *piVar2 = 0x39;
      st_local = (mpt_rawdata_stage *)0x0;
    }
    else {
      if (pmVar4 != (mpt_buffer *)0x0) {
        if (pmVar3 != pmVar4->_content_traits) {
          piVar2 = __errno_location();
          *piVar2 = 0x39;
          return (mpt_value_store *)0x0;
        }
        local_40 = (uint)(pmVar4->_used >> 4);
      }
      if (dim < local_40) {
        local_3c = local_40 << 4;
      }
      else {
        local_3c = (dim + 1) * 0x10;
      }
      if (pmVar4 == (mpt_buffer *)0x0) {
        pmVar4 = (mpt_buffer *)_mpt_buffer_alloc(local_3c,0);
        if (pmVar4 == (mpt_buffer *)0x0) {
          st_local = (mpt_rawdata_stage *)0x0;
        }
        else {
          pmVar4->_content_traits = pmVar3;
          st_local = (mpt_rawdata_stage *)mpt_buffer_insert(pmVar4,(ulong)dim << 4,0x10);
          if (st_local == (mpt_rawdata_stage *)0x0) {
            (*pmVar4->_vptr->unref)(pmVar4);
            st_local = (mpt_rawdata_stage *)0x0;
          }
          else {
            iVar1 = (*pmVar3->init)(st_local,(void *)0x0);
            if (iVar1 < 0) {
              piVar2 = __errno_location();
              *piVar2 = 0x5f;
              (*pmVar4->_vptr->unref)(pmVar4);
              st_local = (mpt_rawdata_stage *)0x0;
            }
            else {
              (st->_d)._buf = pmVar4;
            }
          }
        }
      }
      else {
        pmVar4 = (*pmVar4->_vptr->detach)(pmVar4,(size_t)local_3c);
        if (pmVar4 == (mpt_buffer *)0x0) {
          st_local = (mpt_rawdata_stage *)0x0;
        }
        else {
          (st->_d)._buf = pmVar4;
          if (dim < local_40) {
            st_local = (mpt_rawdata_stage *)(&pmVar4[1]._vptr + (ulong)dim * 2);
          }
          else {
            st_local = (mpt_rawdata_stage *)mpt_buffer_insert(pmVar4,(ulong)dim << 4,0x10);
            if (st_local != (mpt_rawdata_stage *)0x0) {
              (*pmVar3->init)(st_local,(void *)0x0);
            }
          }
        }
      }
    }
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0xc;
    st_local = (mpt_rawdata_stage *)0x0;
  }
  return (mpt_value_store *)st_local;
}

Assistant:

extern MPT_STRUCT(value_store) *mpt_stage_data(MPT_STRUCT(rawdata_stage) *st, unsigned dim)
{
	MPT_STRUCT(buffer) *buf = st->_d._buf;
	const MPT_STRUCT(type_traits) *traits;
	MPT_STRUCT(value_store) *val;
	unsigned max = 0, used = 0;
	
	/* not allowed to extend dimensions */
	if (st->_max_dimensions
	    && (dim >= st->_max_dimensions)) {
		errno = ENOMEM;
		return 0;
	}
	/* array element traits for value store */
	if (!(traits = mpt_value_store_traits())) {
		errno = EBADSLT;
		return 0;
	}
	/* existing buffer must be valied */
	if (buf) {
		if (traits != buf->_content_traits) {
			errno = EBADSLT;
			return 0;
		}
		used = buf->_used / sizeof(*val);
		max  = used;
	}
	if (dim < used) {
		max = used * sizeof(*val);
	} else {
		max = (dim + 1) * sizeof(*val);
	}
	if (!buf) {
		if (!(buf = _mpt_buffer_alloc(max, 0))) {
			return 0;
		}
		buf->_content_traits = traits;
		if (!(val = mpt_buffer_insert(buf, dim * sizeof(*val), sizeof(*val)))) {
			buf->_vptr->unref(buf);
			return 0;
		}
		if ((traits->init(val, 0) < 0)) {
			errno = ENOTSUP;
			buf->_vptr->unref(buf);
			return 0;
		}
		st->_d._buf = buf;
		return val;
	}
	if (!(buf = buf->_vptr->detach(buf, max))) {
		return 0;
	}
	st->_d._buf = buf;
	
	if (dim < used) {
		val = (void *) (buf + 1);
		return val + dim;
	}
	/* execute init function for inserted data */
	if ((val = mpt_buffer_insert(buf, dim * sizeof(*val), sizeof(*val)))) {
		traits->init(val, 0);
	}
	return val;
}